

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O2

void __thiscall ZipArchive::ZipArchive(ZipArchive *this,string *fileName,int numFiles,int strLen)

{
  pointer __p_00;
  ulong __n;
  pointer __p;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_38;
  
  this->zipAlign = false;
  this->force64 = false;
  (this->entries)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  File::File(&this->f,fileName,WRITE);
  this->lastHeader = 0;
  __n = (long)numFiles * 0x4e + (long)strLen;
  __p_00 = (pointer)operator_new__(__n);
  memset(__p_00,0,__n);
  local_38._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)&this->entries
             ,__p_00);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_38);
  this->entryPtr =
       (this->entries)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  this->entryCount = 0;
  return;
}

Assistant:

ZipArchive::ZipArchive(const std::string& fileName, int numFiles, int strLen)
    : f{fileName, File::WRITE}
{
    static_assert(sizeof(LocalEntry) == 30);
    static_assert(sizeof(CentralDirEntry) == 46);

    entries = std::make_unique<uint8_t[]>(
        strLen + numFiles * (sizeof(CentralDirEntry) + sizeof(Extra64)));
    entryPtr = entries.get();
    entryCount = 0;
}